

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O1

void P_DrawSplash2(int count,DVector3 *pos,DAngle *angle,int updown,int kind)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  WORD WVar6;
  uint32 uVar7;
  uint uVar8;
  uint32 uVar9;
  uint uVar10;
  int iVar11;
  particle_t *ppVar12;
  bool bVar13;
  uint32 local_5c;
  
  if (kind == 2) {
    local_5c = grey3;
    uVar7 = grey1;
  }
  else if (kind == 1) {
    local_5c = grey3;
    uVar7 = grey5;
  }
  else if (kind == 0) {
    local_5c = blood1;
    uVar7 = blood2;
  }
  else {
    local_5c = ParticleColor(kind);
    uVar7 = ParticleColor(((uint)kind >> 8 & 0xff) / 3 << 8 |
                          ((uint)kind >> 0x10 & 0xff) / 3 << 0x10 | (kind & 0xffU) / 3);
  }
  if (count != 0) {
    dVar1 = *(double *)(&DAT_0073d760 + (ulong)(updown == 0) * 8);
    iVar11 = count + -1;
    while( true ) {
      WVar6 = InactiveParticles;
      if (InactiveParticles == 0xffff) {
        ppVar12 = (particle_t *)0x0;
      }
      else {
        uVar5 = (ulong)InactiveParticles;
        ppVar12 = Particles + uVar5;
        InactiveParticles = Particles[uVar5].tnext;
        Particles[uVar5].tnext = ActiveParticles;
        ActiveParticles = WVar6;
      }
      if (ppVar12 == (particle_t *)0x0) break;
      ppVar12->ttl = '\f';
      ppVar12->trans = 0xff;
      ppVar12->fade = '\x15';
      ppVar12->size = 4.0;
      uVar8 = FRandom::GenRand32(&M_Random);
      uVar9 = local_5c;
      if (-1 < (char)uVar8) {
        uVar9 = uVar7;
      }
      ppVar12->color = uVar9;
      uVar8 = FRandom::GenRand32(&M_Random);
      (ppVar12->Vel).Z = (double)(uVar8 & 0xff) * -0.001953125;
      (ppVar12->Acc).Z = -0.045454545454545456;
      if (kind != 0) {
        uVar8 = FRandom::GenRand32(&M_Random);
        dVar2 = angle->Degrees;
        uVar10 = FRandom::GenRand32(&M_Random);
        dVar2 = FFastTrig::cos(&fasttrig,
                               ((double)(int)((uVar8 & 0xff) - 0x80) * 0.703125 + dVar2) *
                               11930464.711111112 + 6755399441055744.0);
        (ppVar12->Vel).X = dVar2 * (double)(uVar10 & 0xff) * 0.00048828125;
        uVar8 = FRandom::GenRand32(&M_Random);
        dVar2 = FFastTrig::sin(&fasttrig,(double)(uVar8 & 0xff));
        dVar2 = dVar2 * (double)(uVar8 & 0xff) * 0.00048828125;
        (ppVar12->Vel).Y = dVar2;
        (ppVar12->Acc).X = (ppVar12->Vel).X * 0.0625;
        (ppVar12->Acc).Y = dVar2 * 0.0625;
      }
      uVar8 = FRandom::GenRand32(&M_Random);
      dVar2 = angle->Degrees;
      dVar3 = pos->X;
      uVar10 = FRandom::GenRand32(&M_Random);
      dVar2 = FFastTrig::cos(&fasttrig,
                             ((double)(int)((uVar8 & 0xff) - 0x80) * 0.3515625 + dVar2) *
                             11930464.711111112 + 6755399441055744.0);
      (ppVar12->Pos).X = dVar2 * (double)(int)((uVar10 & 0x1f) - 0xf) + dVar3;
      dVar2 = pos->Y;
      uVar8 = FRandom::GenRand32(&M_Random);
      dVar3 = (double)(int)((uVar8 & 0x1f) - 0xf);
      dVar4 = FFastTrig::sin(&fasttrig,dVar3);
      (ppVar12->Pos).Y = dVar4 * dVar3 + dVar2;
      dVar2 = pos->Z;
      uVar8 = FRandom::GenRand32(&M_Random);
      bVar13 = iVar11 == 0;
      iVar11 = iVar11 + -1;
      (ppVar12->Pos).Z =
           (double)(int)((uVar8 & 0xff) + (updown != 2 | 0xfffffffe) * 0x80) * dVar1 + dVar2;
      if (ppVar12 == (particle_t *)0x0) {
        return;
      }
      if (bVar13) {
        return;
      }
    }
  }
  return;
}

Assistant:

void P_DrawSplash2 (int count, const DVector3 &pos, DAngle angle, int updown, int kind)
{
	int color1, color2, zadd;
	double zvel, zspread;

	switch (kind)
	{
	case 0:		// Blood
		color1 = blood1;
		color2 = blood2;
		break;
	case 1:		// Gunshot
		color1 = grey3;
		color2 = grey5;
		break;
	case 2:		// Smoke
		color1 = grey3;
		color2 = grey1;
		break;
	default:	// colorized blood
		color1 = ParticleColor(kind);
		color2 = ParticleColor(RPART(kind)/3, GPART(kind)/3, BPART(kind)/3);
		break;
	}

	zvel = -1./512.;
	zspread = updown ? -6000 / 65536. : 6000 / 65536.;
	zadd = (updown == 2) ? -128 : 0;

	for (; count; count--)
	{
		particle_t *p = NewParticle ();
		DAngle an;

		if (!p)
			break;

		p->ttl = 12;
		p->fade = FADEFROMTTL(12);
		p->trans = 255;
		p->size = 4;
		p->color = M_Random() & 0x80 ? color1 : color2;
		p->Vel.Z = M_Random() * zvel;
		p->Acc.Z = -1 / 22.;
		if (kind) 
		{
			an = angle + ((M_Random() - 128) * (180 / 256.));
			p->Vel.X = M_Random() * an.Cos() / 2048.;
			p->Vel.Y = M_Random() * an.Sin() / 2048.;
			p->Acc.X = p->Vel.X / 16.;
			p->Acc.Y = p->Vel.Y / 16.;
		}
		an = angle + ((M_Random() - 128) * (90 / 256.));
		p->Pos.X = pos.X + ((M_Random() & 31) - 15) * an.Cos();
		p->Pos.Y = pos.Y + ((M_Random() & 31) - 15) * an.Sin();
		p->Pos.Z = pos.Z + (M_Random() + zadd - 128) * zspread;
	}
}